

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode JsDetachArrayBuffer(JsValueRef arrayBuffer)

{
  JsValueRef local_18;
  JsValueRef arrayBuffer_local;
  
  if (arrayBuffer == (JsValueRef)0x0) {
    arrayBuffer_local._4_4_ = JsErrorInvalidArgument;
  }
  else {
    local_18 = arrayBuffer;
    arrayBuffer_local._4_4_ =
         ContextAPINoScriptWrapper_NoRecord<JsDetachArrayBuffer::__0>
                   ((anon_class_8_1_1fcaf659)&local_18,false,false);
  }
  return arrayBuffer_local._4_4_;
}

Assistant:

CHAKRA_API
JsDetachArrayBuffer(
    _In_ JsValueRef arrayBuffer)
{
    VALIDATE_JSREF(arrayBuffer);
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {

        if (!Js::VarIs<Js::ArrayBuffer>(arrayBuffer))
        {
            return JsErrorInvalidArgument;
        }

        Js::VarTo<Js::ArrayBuffer>(arrayBuffer)->Detach();
        return JsNoError;
    });
}